

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * cargo_get_fprint_args
                 (int argc,char **argv,int start,cargo_fprint_flags_t flags,size_t max_width,
                 size_t highlight_count,...)

{
  char in_AL;
  char *pcVar1;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_d8;
  undefined1 local_b8 [48];
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_d8.reg_save_area = local_b8;
  local_d8.overflow_arg_area = &stack0x00000008;
  local_d8.gp_offset = 0x30;
  local_d8.fp_offset = 0x30;
  pcVar1 = cargo_get_vfprint_args(argc,argv,start,flags,max_width,highlight_count,&local_d8);
  return pcVar1;
}

Assistant:

char *cargo_get_fprint_args(int argc, char **argv, int start,
                            cargo_fprint_flags_t flags,
                            size_t max_width,
                            size_t highlight_count, ...)
{
    char *ret;
    va_list ap;
    va_start(ap, highlight_count);
    ret = cargo_get_vfprint_args(argc, argv, start, flags,
                                max_width, highlight_count, ap);
    va_end(ap);
    return ret;
}